

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popcnt.hpp
# Opt level: O0

uint64_t anon_unknown.dwarf_16dc5d::popcnt64_bitwise_noinline(uint64_t x)

{
  ulong uVar1;
  uint64_t h01;
  uint64_t m4;
  uint64_t m2;
  uint64_t m1;
  uint64_t x_local;
  
  uVar1 = x - (x >> 1 & 0x5555555555555555);
  uVar1 = (uVar1 & 0x3333333333333333) + (uVar1 >> 2 & 0x3333333333333333);
  return (uVar1 + (uVar1 >> 4) & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38;
}

Assistant:

NOINLINE uint64_t popcnt64_bitwise_noinline(uint64_t x)
{
  uint64_t m1 = 0x5555555555555555ull;
  uint64_t m2 = 0x3333333333333333ull;
  uint64_t m4 = 0x0F0F0F0F0F0F0F0Full;
  uint64_t h01 = 0x0101010101010101ull;

  x -= (x >> 1) & m1;
  x = (x & m2) + ((x >> 2) & m2);
  x = (x + (x >> 4)) & m4;

  return (x * h01) >> 56;
}